

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O3

void de::cmdline::detail::Parser::dispatchParse<tcu::opt::EGLWindowType>
               (OptInfo *info,char *src,TypedFieldMap *dst)

{
  string *psVar1;
  Entry local_38;
  
  psVar1 = (string *)operator_new(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  *(undefined8 *)(psVar1 + 8) = 0;
  psVar1[0x10] = (string)0x0;
  if (info->parse == (GenericParseFunc)0x0) {
    findNamedValueMatch(src,info->namedValues,info->namedValuesEnd,info->namedValueStride);
    std::__cxx11::string::_M_assign(psVar1);
  }
  else {
    (*info->parse)(src,psVar1);
  }
  local_38.destructor =
       TypedFieldValueTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::destroy;
  local_38.value = psVar1;
  TypedFieldMap::set(dst,(type_info *)&tcu::opt::EGLWindowType::typeinfo,&local_38);
  return;
}

Assistant:

void Parser::dispatchParse (const OptInfo* info, const char* src, TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		DE_ASSERT((!!info->parse) != (!!info->namedValues));
		if (info->parse)
		{
			((typename Option<OptType>::ParseFunc)(info->parse))(src, value);
		}
		else
		{
			const void* match = findNamedValueMatch(src, info->namedValues, info->namedValuesEnd, info->namedValueStride);
			*value = static_cast<const NamedValue<typename OptTraits<OptType>::ValueType>*>(match)->value;
		}
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}